

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O1

void test_qclab_dense_kron<float>(void)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  bool bVar9;
  pointer *__ptr_3;
  long lVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  float *pfVar12;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer *__ptr_1;
  SquareMatrix<float> A;
  SquareMatrix<float> B;
  SquareMatrix<float> BoA;
  SquareMatrix<float> AoB;
  SquareMatrix<float> XoI;
  AssertionResult gtest_ar__3;
  SquareMatrix<float> IoX;
  SquareMatrix<float> X;
  SquareMatrix<float> I;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  _Head_base<0UL,_float_*,_false> local_e0;
  SquareMatrix<float> local_d8;
  string local_c8;
  internal local_a8;
  undefined7 uStack_a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  internal local_88;
  undefined7 uStack_87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  Message local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  AssertHelper local_68;
  long local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  SquareMatrix<float> local_50;
  SquareMatrix<float> local_40;
  
  local_40.size_ = 2;
  local_40.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined8 *)
   local_40.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x3f800000;
  *(undefined8 *)
   ((long)local_40.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0x3f80000000000000;
  local_50.size_ = 2;
  local_50.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined8 *)
   local_50.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x3f80000000000000;
  *(undefined8 *)
   ((long)local_50.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0x3f800000;
  qclab::dense::kron<float>((dense *)&local_60,&local_40,&local_50);
  pfVar5 = (float *)operator_new__(0x40);
  pfVar5[0] = 0.0;
  pfVar5[1] = 1.0;
  pfVar5[2] = 0.0;
  pfVar5[3] = 0.0;
  pfVar5[4] = 1.0;
  pfVar5[5] = 0.0;
  pfVar5[6] = 0.0;
  pfVar5[7] = 0.0;
  pfVar5[8] = 0.0;
  pfVar5[9] = 0.0;
  pfVar5[10] = 0.0;
  pfVar5[0xb] = 1.0;
  pfVar5[0xc] = 0.0;
  pfVar5[0xd] = 0.0;
  pfVar5[0xe] = 1.0;
  pfVar5[0xf] = 0.0;
  if (local_60 == 4) {
    if ((*pfVar5 != *(float *)&(local_58->_M_dataplus)._M_p) ||
       (NAN(*pfVar5) || NAN(*(float *)&(local_58->_M_dataplus)._M_p))) goto LAB_0019750f;
    local_88 = (internal)0x0;
    lVar10 = 0;
    in_R9 = local_58;
    pfVar6 = pfVar5;
    while( true ) {
      lVar11 = 0;
      do {
        if (lVar11 == 3) goto LAB_00197ab5;
        lVar4 = lVar11 + 1;
        lVar1 = lVar11 + 1;
        pfVar7 = (float *)((long)&(in_R9->_M_dataplus)._M_p + lVar11 * 4 + 4);
      } while ((pfVar6[lVar4] == *pfVar7) && (lVar11 = lVar1, !NAN(pfVar6[lVar4]) && !NAN(*pfVar7)))
      ;
      if (lVar1 < 4) break;
LAB_00197ab5:
      lVar11 = lVar10 + 1;
      local_88 = (internal)(3 < lVar11);
      if (lVar11 == 4) break;
      pfVar6 = pfVar6 + 4;
      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_R9->field_2;
      paVar2 = &local_58->field_2 + lVar10;
      if ((pfVar5[lVar11 * 4] != *(float *)paVar2) ||
         (lVar10 = lVar11, NAN(pfVar5[lVar11 * 4]) || NAN(*(float *)paVar2))) break;
    }
  }
  else {
LAB_0019750f:
    local_88 = (internal)0x0;
  }
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88 == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,&local_88,(AssertionResult *)"IoX == IoX_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x14,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  qclab::dense::kron<float>((dense *)&local_88,&local_50,&local_40);
  pfVar6 = (float *)operator_new__(0x40);
  pfVar6[0] = 0.0;
  pfVar6[1] = 0.0;
  pfVar6[2] = 1.0;
  pfVar6[3] = 0.0;
  pfVar6[4] = 0.0;
  pfVar6[5] = 0.0;
  pfVar6[6] = 0.0;
  pfVar6[7] = 1.0;
  pfVar6[8] = 1.0;
  pfVar6[9] = 0.0;
  pfVar6[10] = 0.0;
  pfVar6[0xb] = 0.0;
  pfVar6[0xc] = 0.0;
  pfVar6[0xd] = 1.0;
  pfVar6[0xe] = 0.0;
  pfVar6[0xf] = 0.0;
  if (CONCAT71(uStack_87,local_88) == 4) {
    if ((*pfVar6 != *(float *)&(local_80->_M_dataplus)._M_p) ||
       (NAN(*pfVar6) || NAN(*(float *)&(local_80->_M_dataplus)._M_p))) goto LAB_0019764d;
    bVar9 = false;
    lVar10 = 0;
    in_R9 = local_80;
    pfVar7 = pfVar6;
    while( true ) {
      lVar11 = 0;
      do {
        if (lVar11 == 3) goto LAB_00197b31;
        lVar4 = lVar11 + 1;
        lVar1 = lVar11 + 1;
        pfVar8 = (float *)((long)&(in_R9->_M_dataplus)._M_p + lVar11 * 4 + 4);
      } while ((pfVar7[lVar4] == *pfVar8) && (lVar11 = lVar1, !NAN(pfVar7[lVar4]) && !NAN(*pfVar8)))
      ;
      if (lVar1 < 4) break;
LAB_00197b31:
      lVar11 = lVar10 + 1;
      bVar9 = 3 < lVar11;
      if (lVar11 == 4) break;
      pfVar7 = pfVar7 + 4;
      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_R9->field_2;
      paVar2 = &local_80->field_2 + lVar10;
      if ((pfVar6[lVar11 * 4] != *(float *)paVar2) ||
         (lVar10 = lVar11, NAN(pfVar6[lVar11 * 4]) || NAN(*(float *)paVar2))) break;
    }
  }
  else {
LAB_0019764d:
    bVar9 = false;
  }
  local_e8[0] = bVar9;
  local_e0._M_head_impl = (float *)0x0;
  if (bVar9 == false) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_e8,(AssertionResult *)"XoI == XoI_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x1c,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_d8.size_ != (long *)0x0) {
      (**(code **)(*(long *)local_d8.size_ + 8))();
    }
  }
  if (local_e0._M_head_impl != (float *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl);
  }
  local_e8 = (undefined1  [8])0x2;
  local_e0._M_head_impl = (float *)operator_new__(0x10);
  *(undefined8 *)local_e0._M_head_impl = 0x404000003f800000;
  *(undefined8 *)((long)local_e0._M_head_impl + 8) = 0x40a0000040000000;
  local_d8.size_ = 2;
  local_d8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined8 *)
   local_d8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x4150000040e00000;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0x4188000041300000;
  qclab::dense::kron<float>((dense *)&local_98,(SquareMatrix<float> *)local_e8,&local_d8);
  pfVar7 = (float *)operator_new__(0x40);
  pfVar7[0] = 7.0;
  pfVar7[1] = 13.0;
  pfVar7[2] = 21.0;
  pfVar7[3] = 39.0;
  pfVar7[4] = 11.0;
  pfVar7[5] = 17.0;
  pfVar7[6] = 33.0;
  pfVar7[7] = 51.0;
  pfVar7[8] = 14.0;
  pfVar7[9] = 26.0;
  pfVar7[10] = 35.0;
  pfVar7[0xb] = 65.0;
  pfVar7[0xc] = 22.0;
  pfVar7[0xd] = 34.0;
  pfVar7[0xe] = 55.0;
  pfVar7[0xf] = 85.0;
  if (local_98.data_ == (AssertHelperData *)&DAT_00000004) {
    if ((*pfVar7 != *(float *)&(local_90->_M_dataplus)._M_p) ||
       (NAN(*pfVar7) || NAN(*(float *)&(local_90->_M_dataplus)._M_p))) goto LAB_001977bb;
    local_a8 = (internal)0x0;
    lVar10 = 0;
    in_R9 = local_90;
    pfVar8 = pfVar7;
    while( true ) {
      lVar11 = 0;
      do {
        if (lVar11 == 3) goto LAB_00197bad;
        lVar4 = lVar11 + 1;
        lVar1 = lVar11 + 1;
        pfVar12 = (float *)((long)&(in_R9->_M_dataplus)._M_p + lVar11 * 4 + 4);
      } while ((pfVar8[lVar4] == *pfVar12) &&
              (lVar11 = lVar1, !NAN(pfVar8[lVar4]) && !NAN(*pfVar12)));
      if (lVar1 < 4) break;
LAB_00197bad:
      lVar11 = lVar10 + 1;
      local_a8 = (internal)(3 < lVar11);
      if (lVar11 == 4) break;
      pfVar8 = pfVar8 + 4;
      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_R9->field_2;
      paVar2 = &local_90->field_2 + lVar10;
      if ((pfVar7[lVar11 * 4] != *(float *)paVar2) ||
         (lVar10 = lVar11, NAN(pfVar7[lVar11 * 4]) || NAN(*(float *)paVar2))) break;
    }
  }
  else {
LAB_001977bb:
    local_a8 = (internal)0x0;
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8 == (internal)0x0) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,&local_a8,(AssertionResult *)"AoB == AoB_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x2b,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_78.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_78.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_78.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  qclab::dense::kron<float>((dense *)&local_a8,&local_d8,(SquareMatrix<float> *)local_e8);
  pfVar8 = (float *)operator_new__(0x40);
  pfVar8[0] = 7.0;
  pfVar8[1] = 21.0;
  pfVar8[2] = 13.0;
  pfVar8[3] = 39.0;
  pfVar8[4] = 14.0;
  pfVar8[5] = 35.0;
  pfVar8[6] = 26.0;
  pfVar8[7] = 65.0;
  pfVar8[8] = 11.0;
  pfVar8[9] = 33.0;
  pfVar8[10] = 17.0;
  pfVar8[0xb] = 51.0;
  pfVar8[0xc] = 22.0;
  pfVar8[0xd] = 55.0;
  pfVar8[0xe] = 34.0;
  pfVar8[0xf] = 85.0;
  if (CONCAT71(uStack_a7,local_a8) == 4) {
    if ((*pfVar8 == *(float *)&(local_a0->_M_dataplus)._M_p) &&
       (!NAN(*pfVar8) && !NAN(*(float *)&(local_a0->_M_dataplus)._M_p))) {
      local_78.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)0x0;
      lVar10 = 0;
      in_R9 = local_a0;
      pfVar12 = pfVar8;
      while( true ) {
        lVar11 = 0;
        do {
          if (lVar11 == 3) goto LAB_00197c29;
          lVar4 = lVar11 + 1;
          lVar1 = lVar11 + 1;
          pfVar3 = (float *)((long)&(in_R9->_M_dataplus)._M_p + lVar11 * 4 + 4);
        } while ((pfVar12[lVar4] == *pfVar3) &&
                (lVar11 = lVar1, !NAN(pfVar12[lVar4]) && !NAN(*pfVar3)));
        if (lVar1 < 4) break;
LAB_00197c29:
        lVar11 = lVar10 + 1;
        local_78.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = (internal)(3 < lVar11);
        if (lVar11 == 4) break;
        pfVar12 = pfVar12 + 4;
        in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_R9->field_2
        ;
        paVar2 = &local_a0->field_2 + lVar10;
        if ((pfVar8[lVar11 * 4] != *(float *)paVar2) ||
           (lVar10 = lVar11, NAN(pfVar8[lVar11 * 4]) || NAN(*(float *)paVar2))) break;
      }
      goto LAB_001978f3;
    }
  }
  local_78.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)0x0;
LAB_001978f3:
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)&local_78,(AssertionResult *)"BoA == BoA_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x33,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  operator_delete__(pfVar8);
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_a0);
  }
  operator_delete__(pfVar7);
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_90);
  }
  if (local_d8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_d8.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)local_e0._M_head_impl !=
      (float *)0x0) {
    operator_delete__(local_e0._M_head_impl);
  }
  operator_delete__(pfVar6);
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_80);
  }
  operator_delete__(pfVar5);
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_58);
  }
  if (local_50.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_50.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)
      local_40.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (float *)0x0) {
    operator_delete__((void *)local_40.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}